

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void destStoreMonoLsb(QRasterBuffer *rasterBuffer,int x,int y,uint *buffer,int length)

{
  QRgb QVar1;
  uchar *puVar2;
  QRgb QVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  
  lVar10 = (long)y * rasterBuffer->bytes_per_line;
  uVar9 = 0;
  puVar2 = rasterBuffer->m_buffer;
  if (0 < length) {
    uVar9 = (ulong)(uint)length;
  }
  if (rasterBuffer->monoDestinationWithClut == false) {
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      iVar4 = qGray(buffer[uVar7]);
      uVar6 = (uint)((uint)x + uVar7);
      lVar5 = (long)((int)uVar6 >> 3);
      bVar8 = (byte)(1 << ((byte)((uint)x + uVar7) & 7));
      if (iVar4 < *(int *)((long)qt_bayer_matrix[0] +
                          (ulong)(uVar6 & 0xf) * 4 + (ulong)((y & 0xfU) << 6))) {
        bVar8 = puVar2[lVar5 + lVar10] | bVar8;
      }
      else {
        bVar8 = puVar2[lVar5 + lVar10] & ~bVar8;
      }
      puVar2[lVar5 + lVar10] = bVar8;
    }
  }
  else {
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      QVar3 = buffer[uVar7];
      QVar1 = rasterBuffer->destColor0;
      iVar4 = (int)((uint)x + uVar7) >> 3;
      bVar8 = (byte)((uint)x + uVar7);
      if (QVar3 == QVar1) {
        puVar2[iVar4 + lVar10] = puVar2[iVar4 + lVar10] & ~(byte)(1 << (bVar8 & 7));
      }
      else if (QVar3 == rasterBuffer->destColor1) {
        puVar2[iVar4 + lVar10] = puVar2[iVar4 + lVar10] | (byte)(1 << (bVar8 & 7));
      }
      else {
        QVar3 = findNearestColor(QVar3,rasterBuffer);
        bVar8 = (byte)(1 << (bVar8 & 7));
        if (QVar3 == QVar1) {
          bVar8 = puVar2[iVar4 + lVar10] & ~bVar8;
        }
        else {
          bVar8 = puVar2[iVar4 + lVar10] | bVar8;
        }
        puVar2[iVar4 + lVar10] = bVar8;
      }
    }
  }
  return;
}

Assistant:

static void QT_FASTCALL destStoreMonoLsb(QRasterBuffer *rasterBuffer, int x, int y, const uint *buffer, int length)
{
    uchar *Q_DECL_RESTRICT data = (uchar *)rasterBuffer->scanLine(y);
    if (rasterBuffer->monoDestinationWithClut) {
        for (int i = 0; i < length; ++i) {
            if (buffer[i] == rasterBuffer->destColor0) {
                data[x >> 3] &= ~(1 << (x & 7));
            } else if (buffer[i] == rasterBuffer->destColor1) {
                data[x >> 3] |= 1 << (x & 7);
            } else if (findNearestColor(buffer[i], rasterBuffer) == rasterBuffer->destColor0) {
                data[x >> 3] &= ~(1 << (x & 7));
            } else {
                data[x >> 3] |= 1 << (x & 7);
            }
            ++x;
        }
    } else {
        for (int i = 0; i < length; ++i) {
            if (qGray(buffer[i]) < int(qt_bayer_matrix[y & 15][x & 15]))
                data[x >> 3] |= 1 << (x & 7);
            else
                data[x >> 3] &= ~(1 << (x & 7));
            ++x;
        }
    }
}